

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O0

void __thiscall CServerBrowser::Refresh(CServerBrowser *this,int RefreshFlags)

{
  int iVar1;
  uint uVar2;
  int64 iVar3;
  CConfig *pCVar4;
  uint in_ESI;
  CServerBrowser *in_RDI;
  long in_FS_OFFSET;
  int i;
  CServerEntry *pEntry;
  int Port;
  CNetChunk Packet;
  CPacker Packer;
  uint size;
  undefined4 in_stack_fffffffffffff790;
  undefined4 in_stack_fffffffffffff794;
  CServerEntry *local_868;
  int in_stack_fffffffffffff7a0;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffff7b8;
  TOKEN in_stack_fffffffffffff7bc;
  int in_stack_fffffffffffff7c0;
  int in_stack_fffffffffffff7c4;
  undefined2 in_stack_fffffffffffff7c8;
  undefined2 in_stack_fffffffffffff7ca;
  undefined4 in_stack_fffffffffffff7cc;
  int in_stack_fffffffffffff7d0;
  undefined4 in_stack_fffffffffffff7d4;
  CPacker local_820;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->m_RefreshFlags = in_ESI | in_RDI->m_RefreshFlags;
  size = (uint)((ulong)in_RDI >> 0x20);
  if ((in_ESI & 2) != 0) {
    CServerlist::Clear((CServerlist *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790))
    ;
    if (in_RDI->m_ActServerlistType == 1) {
      CServerBrowserFilter::Clear
                ((CServerBrowserFilter *)CONCAT44(in_ESI,in_stack_fffffffffffff7a0));
    }
    iVar1 = GetNewToken();
    in_RDI->m_CurrentLanToken = iVar1;
    CPacker::Reset(&local_820);
    CPacker::AddRaw(&local_820,SERVERBROWSE_GETINFO,8);
    CPacker::AddInt((CPacker *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),size);
    mem_zero((void *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),size);
    uVar2 = CNetBase::NetType(&in_RDI->m_pNetClient->super_CNetBase);
    uVar2 = uVar2 | 4;
    uVar5 = 0xffffffff;
    in_stack_fffffffffffff7cc = 2;
    in_stack_fffffffffffff7d0 = CPacker::Size(&local_820);
    CPacker::Data(&local_820);
    iVar3 = time_get();
    in_RDI->m_BroadcastTime = iVar3;
    for (in_stack_fffffffffffff7a0 = 0x206f; in_stack_fffffffffffff7a0 < 0x2077;
        in_stack_fffffffffffff7a0 = in_stack_fffffffffffff7a0 + 1) {
      in_stack_fffffffffffff7c8 = (undefined2)in_stack_fffffffffffff7a0;
      CNetClient::Send((CNetClient *)
                       CONCAT44(in_stack_fffffffffffff7cc,
                                CONCAT22(in_stack_fffffffffffff7ca,in_stack_fffffffffffff7c8)),
                       (CNetChunk *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                       in_stack_fffffffffffff7bc,(CSendCBData *)CONCAT44(uVar2,uVar5));
    }
    pCVar4 = Config(in_RDI);
    if (pCVar4->m_Debug != 0) {
      (*(in_RDI->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (in_RDI->m_pConsole,2,"client_srvbrowse","broadcasting for servers",0);
    }
  }
  if ((in_ESI & 1) != 0) {
    for (local_868 = in_RDI->m_pFirstReqServer; local_868 != (CServerEntry *)0x0;
        local_868 = local_868->m_pNextReq) {
      CNetClient::PurgeStoredPacket
                ((CNetClient *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),size);
    }
    CServerlist::Clear((CServerlist *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790))
    ;
    if (in_RDI->m_ActServerlistType == 0) {
      CServerBrowserFilter::Clear
                ((CServerBrowserFilter *)CONCAT44(in_ESI,in_stack_fffffffffffff7a0));
    }
    in_RDI->m_pFirstReqServer = (CServerEntry *)0x0;
    in_RDI->m_pLastReqServer = (CServerEntry *)0x0;
    in_RDI->m_NumRequests = 0;
    in_RDI->m_NeedRefresh = 1;
    for (iVar1 = 0; iVar1 < (in_RDI->m_ServerBrowserFavorites).m_NumFavoriteServers;
        iVar1 = iVar1 + 1) {
      if (2 < (in_RDI->m_ServerBrowserFavorites).m_aFavoriteServers[iVar1].m_State) {
        Set((CServerBrowser *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
            (NETADDR *)
            CONCAT44(in_stack_fffffffffffff7cc,
                     CONCAT22(in_stack_fffffffffffff7ca,in_stack_fffffffffffff7c8)),
            in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0,
            (CServerInfo *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CServerBrowser::Refresh(int RefreshFlags)
{
	m_RefreshFlags |= RefreshFlags;

	if(RefreshFlags&IServerBrowser::REFRESHFLAG_LAN)
	{
		// clear out everything
		m_aServerlist[IServerBrowser::TYPE_LAN].Clear();
		if(m_ActServerlistType == IServerBrowser::TYPE_LAN)
			m_ServerBrowserFilter.Clear();

		// next token
		m_CurrentLanToken = GetNewToken();

		CPacker Packer;
		Packer.Reset();
		Packer.AddRaw(SERVERBROWSE_GETINFO, sizeof(SERVERBROWSE_GETINFO));
		Packer.AddInt(m_CurrentLanToken);

		/* do the broadcast version */
		CNetChunk Packet;
		mem_zero(&Packet, sizeof(Packet));
		Packet.m_Address.type = m_pNetClient->NetType()|NETTYPE_LINK_BROADCAST;
		Packet.m_ClientID = -1;
		Packet.m_Flags = NETSENDFLAG_CONNLESS;
		Packet.m_DataSize = Packer.Size();
		Packet.m_pData = Packer.Data();
		m_BroadcastTime = time_get();

		for(int Port = LAN_PORT_BEGIN; Port <= LAN_PORT_END; Port++)
		{
			Packet.m_Address.port = Port;
			m_pNetClient->Send(&Packet);
		}

		if(Config()->m_Debug)
			m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client_srvbrowse", "broadcasting for servers");
	}

	if(RefreshFlags&IServerBrowser::REFRESHFLAG_INTERNET)
	{
		// clear out everything
		for(CServerEntry *pEntry = m_pFirstReqServer; pEntry; pEntry = pEntry->m_pNextReq)
		{
			m_pNetClient->PurgeStoredPacket(pEntry->m_TrackID);
		}
		m_aServerlist[IServerBrowser::TYPE_INTERNET].Clear();
		if(m_ActServerlistType == IServerBrowser::TYPE_INTERNET)
			m_ServerBrowserFilter.Clear();
		m_pFirstReqServer = 0;
		m_pLastReqServer = 0;
		m_NumRequests = 0;

		m_NeedRefresh = 1;
		for(int i = 0; i < m_ServerBrowserFavorites.m_NumFavoriteServers; i++)
			if(m_ServerBrowserFavorites.m_aFavoriteServers[i].m_State >= CServerBrowserFavorites::FAVSTATE_ADDR)
				Set(m_ServerBrowserFavorites.m_aFavoriteServers[i].m_Addr, SET_FAV_ADD, -1, 0);
	}
}